

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O2

int xmlwrite_time(archive_write *a,xml_writer *writer,char *key,time_t t,int z)

{
  int iVar1;
  size_t sVar2;
  time_t t_local;
  char timestr [100];
  tm_conflict tm;
  
  t_local = t;
  gmtime_r(&t_local,(tm *)&tm);
  timestr[0] = '\0';
  timestr[1] = '\0';
  timestr[2] = '\0';
  timestr[3] = '\0';
  timestr[4] = '\0';
  timestr[5] = '\0';
  timestr[6] = '\0';
  timestr[7] = '\0';
  timestr[8] = '\0';
  timestr[9] = '\0';
  timestr[10] = '\0';
  timestr[0xb] = '\0';
  timestr[0xc] = '\0';
  timestr[0xd] = '\0';
  timestr[0xe] = '\0';
  timestr[0xf] = '\0';
  timestr[0x10] = '\0';
  timestr[0x11] = '\0';
  timestr[0x12] = '\0';
  timestr[0x13] = '\0';
  timestr[0x14] = '\0';
  timestr[0x15] = '\0';
  timestr[0x16] = '\0';
  timestr[0x17] = '\0';
  timestr[0x18] = '\0';
  timestr[0x19] = '\0';
  timestr[0x1a] = '\0';
  timestr[0x1b] = '\0';
  timestr[0x1c] = '\0';
  timestr[0x1d] = '\0';
  timestr[0x1e] = '\0';
  timestr[0x1f] = '\0';
  timestr[0x20] = '\0';
  timestr[0x21] = '\0';
  timestr[0x22] = '\0';
  timestr[0x23] = '\0';
  timestr[0x24] = '\0';
  timestr[0x25] = '\0';
  timestr[0x26] = '\0';
  timestr[0x27] = '\0';
  timestr[0x28] = '\0';
  timestr[0x29] = '\0';
  timestr[0x2a] = '\0';
  timestr[0x2b] = '\0';
  timestr[0x2c] = '\0';
  timestr[0x2d] = '\0';
  timestr[0x2e] = '\0';
  timestr[0x2f] = '\0';
  timestr[0x30] = '\0';
  timestr[0x31] = '\0';
  timestr[0x32] = '\0';
  timestr[0x33] = '\0';
  timestr[0x34] = '\0';
  timestr[0x35] = '\0';
  timestr[0x36] = '\0';
  timestr[0x37] = '\0';
  timestr[0x38] = '\0';
  timestr[0x39] = '\0';
  timestr[0x3a] = '\0';
  timestr[0x3b] = '\0';
  timestr[0x3c] = '\0';
  timestr[0x3d] = '\0';
  timestr[0x3e] = '\0';
  timestr[0x3f] = '\0';
  timestr[0x40] = '\0';
  timestr[0x41] = '\0';
  timestr[0x42] = '\0';
  timestr[0x43] = '\0';
  timestr[0x44] = '\0';
  timestr[0x45] = '\0';
  timestr[0x46] = '\0';
  timestr[0x47] = '\0';
  timestr[0x48] = '\0';
  timestr[0x49] = '\0';
  timestr[0x4a] = '\0';
  timestr[0x4b] = '\0';
  timestr[0x4c] = '\0';
  timestr[0x4d] = '\0';
  timestr[0x4e] = '\0';
  timestr[0x4f] = '\0';
  timestr[0x50] = '\0';
  timestr[0x51] = '\0';
  timestr[0x52] = '\0';
  timestr[0x53] = '\0';
  timestr[0x54] = '\0';
  timestr[0x55] = '\0';
  timestr[0x56] = '\0';
  timestr[0x57] = '\0';
  timestr[0x58] = '\0';
  timestr[0x59] = '\0';
  timestr[0x5a] = '\0';
  timestr[0x5b] = '\0';
  timestr[0x5c] = '\0';
  timestr[0x5d] = '\0';
  timestr[0x5e] = '\0';
  timestr[0x5f] = '\0';
  timestr[0x60] = '\0';
  timestr[0x61] = '\0';
  timestr[0x62] = '\0';
  timestr[99] = '\0';
  strftime(timestr,100,"%Y-%m-%dT%H:%M:%S",(tm *)&tm);
  if (z != 0) {
    sVar2 = strlen(timestr);
    (timestr + sVar2)[0] = 'Z';
    (timestr + sVar2)[1] = '\0';
  }
  iVar1 = xmlwrite_string(a,writer,key,timestr);
  return iVar1;
}

Assistant:

static int
xmlwrite_time(struct archive_write *a, struct xml_writer *writer,
	const char *key, time_t t, int z)
{
	char timestr[100];
	struct tm tm;

#if defined(HAVE_GMTIME_S)
	gmtime_s(&tm, &t);
#elif defined(HAVE_GMTIME_R)
	gmtime_r(&t, &tm);
#else
	memcpy(&tm, gmtime(&t), sizeof(tm));
#endif
	memset(&timestr, 0, sizeof(timestr));
	/* Do not use %F and %T for portability. */
	strftime(timestr, sizeof(timestr), "%Y-%m-%dT%H:%M:%S", &tm);
	if (z)
		strcat(timestr, "Z");
	return (xmlwrite_string(a, writer, key, timestr));
}